

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

void __thiscall
despot::util::tinyxml::TiXmlParsingData::Stamp
          (TiXmlParsingData *this,char *now,TiXmlEncoding encoding)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  bool bVar8;
  
  if (now == (char *)0x0) {
    __assert_fail("now",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0xc0,
                  "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                 );
  }
  iVar3 = this->tabsize;
  if (0 < iVar3) {
    if ((byte *)this->stamp == (byte *)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0xcb,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    iVar6 = (this->cursor).row;
    iVar4 = (this->cursor).col;
    pbVar7 = (byte *)this->stamp;
joined_r0x001718ca:
    while (pbVar7 < now) {
      bVar1 = *pbVar7;
      if (bVar1 < 0xd) {
        if (bVar1 != 9) {
          if (bVar1 == 10) {
            bVar8 = pbVar7[1] == 0xd;
            goto LAB_00171913;
          }
          if (bVar1 == 0) {
            return;
          }
LAB_00171961:
          if (encoding == TIXML_ENCODING_UTF8) {
            pbVar7 = pbVar7 + *(int *)(TiXmlBase::utf8ByteTable + (ulong)bVar1 * 4);
          }
          else {
            pbVar7 = pbVar7 + 1;
          }
          goto LAB_00171976;
        }
        pbVar7 = pbVar7 + 1;
        iVar4 = (iVar4 / iVar3 + 1) * iVar3;
      }
      else if (bVar1 == 0xef) {
        if (encoding == TIXML_ENCODING_UTF8) goto code_r0x00171937;
        iVar4 = iVar4 + 1;
        pbVar7 = pbVar7 + 1;
      }
      else {
        if (bVar1 != 0xd) goto LAB_00171961;
        bVar8 = pbVar7[1] == 10;
LAB_00171913:
        iVar6 = iVar6 + 1;
        pbVar5 = pbVar7 + 1;
        if (bVar8) {
          pbVar5 = pbVar7 + 2;
        }
        iVar4 = 0;
        pbVar7 = pbVar5;
      }
    }
    (this->cursor).row = iVar6;
    (this->cursor).col = iVar4;
    if (iVar6 < -1) {
      __assert_fail("cursor.row >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x127,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    if (iVar4 < -1) {
      __assert_fail("cursor.col >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x128,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    this->stamp = (char *)pbVar7;
  }
  return;
code_r0x00171937:
  bVar1 = pbVar7[1];
  if ((bVar1 != 0) && (bVar2 = pbVar7[2], bVar2 != 0)) {
    if ((bVar2 == 0xbf && bVar1 == 0xbb) ||
       ((bVar1 == 0xbf && ((bVar2 == 0xbe || (bVar2 == 0xbf)))))) {
      pbVar7 = pbVar7 + 3;
    }
    else {
      pbVar7 = pbVar7 + 3;
LAB_00171976:
      iVar4 = iVar4 + 1;
    }
  }
  goto joined_r0x001718ca;
}

Assistant:

void TiXmlParsingData::Stamp(const char* now, TiXmlEncoding encoding) {
	assert(now);

	// Do nothing if the tabsize is 0.
	if (tabsize < 1) {
		return;
	}

	// Get the current row, column.
	int row = cursor.row;
	int col = cursor.col;
	const char* p = stamp;
	assert(p);

	while (p < now) {
		// Treat p as unsigned, so we have a happy compiler.
		const unsigned char* pU = (const unsigned char*) p;

		// Code contributed by Fletcher Dunn: (modified by lee)
		switch (*pU) {
		case 0:
			// We *should* never get here, but in case we do, don't
			// advance past the terminating null character, ever
			return;

		case '\r':
			// bump down to the next line
			++row;
			col = 0;
			// Eat the character
			++p;

			// Check for \r\n sequence, and treat this as a single character
			if (*p == '\n') {
				++p;
			}
			break;

		case '\n':
			// bump down to the next line
			++row;
			col = 0;

			// Eat the character
			++p;

			// Check for \n\r sequence, and treat this as a single
			// character.  (Yes, this bizarre thing does occur still
			// on some arcane platforms...)
			if (*p == '\r') {
				++p;
			}
			break;

		case '\t':
			// Eat the character
			++p;

			// Skip to next tab stop
			col = (col / tabsize + 1) * tabsize;
			break;

		case TIXML_UTF_LEAD_0:
			if (encoding == TIXML_ENCODING_UTF8) {
				if (*(p + 1) && *(p + 2)) {
					// In these cases, don't advance the column. These are
					// 0-width spaces.
					if (*(pU + 1) == TIXML_UTF_LEAD_1
						&& *(pU + 2) == TIXML_UTF_LEAD_2)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbeU)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbfU)
						p += 3;
					else {
						p += 3;
						++col;
					} // A normal character.
				}
			} else {
				++p;
				++col;
			}
			break;

		default:
			if (encoding == TIXML_ENCODING_UTF8) {
				// Eat the 1 to 4 byte utf8 character.
				int step = TiXmlBase::utf8ByteTable[*((const unsigned char*) p)];
				if (step == 0)
					step = 1; // Error case from bad encoding, but handle gracefully.
				p += step;

				// Just advance one column, of course.
				++col;
			} else {
				++p;
				++col;
			}
			break;
		}
	}
	cursor.row = row;
	cursor.col = col;
	assert(cursor.row >= -1);
	assert(cursor.col >= -1);
	stamp = p;
	assert(stamp);
}